

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O0

int deqp::gles31::Functional::anon_unknown_3::getNumTypeInstances
              (Shader *shader,Storage storage,_func_bool_DataType *predicate)

{
  int iVar1;
  InstanceCounter local_30;
  VariableDeclarationStorageFilter local_28;
  InterfaceBlockStorageFilter local_24;
  _func_bool_DataType *local_20;
  _func_bool_DataType *predicate_local;
  Shader *pSStack_10;
  Storage storage_local;
  Shader *shader_local;
  
  local_20 = predicate;
  predicate_local._4_4_ = storage;
  pSStack_10 = shader;
  InterfaceBlockStorageFilter::InterfaceBlockStorageFilter(&local_24,storage);
  VariableDeclarationStorageFilter::VariableDeclarationStorageFilter
            (&local_28,predicate_local._4_4_);
  InstanceCounter::InstanceCounter(&local_30,local_20);
  iVar1 = Functional::(anonymous_namespace)::
          accumulateShader<deqp::gles31::Functional::(anonymous_namespace)::InterfaceBlockStorageFilter,deqp::gles31::Functional::(anonymous_namespace)::VariableDeclarationStorageFilter,deqp::gles31::Functional::(anonymous_namespace)::InstanceCounter>
                    (shader,&local_24,&local_28,&local_30);
  return iVar1;
}

Assistant:

static int getNumTypeInstances (const ProgramInterfaceDefinition::Shader* shader, glu::Storage storage, bool (*predicate)(glu::DataType))
{
	return accumulateShader(shader, InterfaceBlockStorageFilter(storage), VariableDeclarationStorageFilter(storage), InstanceCounter(predicate));
}